

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHDivProjection.cpp
# Opt level: O1

void __thiscall
TPZHDivProjection<double>::Contribute
          (TPZHDivProjection<double> *this,TPZMaterialDataT<double> *data,REAL weight,
          TPZFMatrix<double> *ek,TPZFMatrix<double> *ef)

{
  TPZFNMatrix<20,_double> *pTVar1;
  TPZFNMatrix<60,_double> *pTVar2;
  TPZFNMatrix<9,_double> *this_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int64_t iVar8;
  pair<int,_long> *ppVar9;
  char cVar10;
  ulong uVar11;
  int id;
  long lVar12;
  long lVar13;
  int i;
  long lVar14;
  ulong uVar15;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  TPZManVector<double,_4> solLoc;
  TPZFNMatrix<3,_double> ivec;
  TPZFNMatrix<3,_double> axesvec_1;
  TPZFNMatrix<3,_double> axesvec;
  TPZFNMatrix<3,_double> jvec;
  double local_3e8;
  double local_3d0;
  uint local_3c0;
  int local_390;
  TPZVec<double> local_360;
  double local_340 [4];
  double *local_320;
  TPZFMatrix<double> *local_318;
  double *local_310;
  double local_308;
  double local_300;
  double local_2f8;
  TPZFMatrix<double> local_2f0;
  double local_260 [4];
  TPZFMatrix<double> local_240;
  double local_1b0 [4];
  TPZFMatrix<double> local_190;
  double local_100 [4];
  TPZFMatrix<double> local_e0;
  double local_50 [4];
  
  TPZVec<double>::TPZVec(&local_360,0);
  local_360._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a32e0;
  local_360.fStore = local_340;
  local_360.fNElements = 4;
  local_360.fNAlloc = 0;
  cVar10 = (**(code **)(*(long *)this + 0x60))(this);
  if (cVar10 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZHDivProjection<>::Contribute(const TPZMaterialDataT<TVar> &, REAL, TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) [TVar = double]"
               ,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," a forcing function (solution to be projected)\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"has not been set! Aborting...\n",0x1e);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Material/Projection/TPZHDivProjection.cpp"
               ,0x1e);
  }
  if (*(long *)&this->field_0x28 == 0) {
    std::__throw_bad_function_call();
  }
  (**(code **)&this->field_0x30)(&this->field_0x18,&(data->super_TPZMaterialData).x,&local_360);
  iVar8 = (data->super_TPZMaterialData).fVecShapeIndex.super_TPZVec<std::pair<int,_long>_>.
          fNElements;
  local_2f0.fElem = local_260;
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0186ce28;
  local_2f0.fSize = 3;
  local_2f0.fGiven = local_2f0.fElem;
  TPZVec<int>::TPZVec(&local_2f0.fPivot.super_TPZVec<int>,0);
  local_2f0.fPivot.super_TPZVec<int>.fStore = local_2f0.fPivot.fExtAlloc;
  local_2f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_2f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_2f0.fWork.fStore = (double *)0x0;
  local_2f0.fWork.fNElements = 0;
  local_2f0.fWork.fNAlloc = 0;
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0186cb38;
  TPZFMatrix<double>::operator=(&local_2f0,0.0);
  local_e0.fElem = local_50;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0186ce28;
  local_e0.fSize = 3;
  local_e0.fGiven = local_e0.fElem;
  TPZVec<int>::TPZVec(&local_e0.fPivot.super_TPZVec<int>,0);
  local_e0.fPivot.super_TPZVec<int>.fStore = local_e0.fPivot.fExtAlloc;
  local_e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_e0.fWork.fStore = (double *)0x0;
  local_e0.fWork.fNElements = 0;
  local_e0.fWork.fNAlloc = 0;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0186cb38;
  local_318 = ef;
  TPZFMatrix<double>::operator=(&local_e0,0.0);
  local_3c0 = (uint)iVar8;
  if (0 < (int)local_3c0) {
    pTVar1 = &(data->super_TPZMaterialData).phi;
    pTVar2 = &(data->super_TPZMaterialData).dphix;
    local_320 = local_100;
    this_00 = &(data->super_TPZMaterialData).axes;
    local_310 = local_1b0;
    uVar11 = 0;
    do {
      ppVar9 = (data->super_TPZMaterialData).fVecShapeIndex.super_TPZVec<std::pair<int,_long>_>.
               fStore;
      iVar7 = ppVar9[uVar11].first;
      lVar13 = ppVar9[uVar11].second;
      lVar12 = 0;
      do {
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar12) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_2f0.fElem[lVar12] =
             (data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.fElem
             [(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
              super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * (long)iVar7 + lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_3e8 = 0.0;
      lVar12 = 0;
      do {
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar12) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_3e8 = local_3e8 + local_2f0.fElem[lVar12] * local_360.fStore[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar13 = (long)(int)lVar13;
      (*(pTVar1->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable[0x24])(pTVar1,lVar13,0);
      if (((local_318->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar11) ||
         ((local_318->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_318->fElem[uVar11] = local_3e8 * weight * extraout_XMM0_Qa + local_318->fElem[uVar11];
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0186ce28;
      local_190.fElem = local_320;
      local_190.fGiven = local_320;
      local_190.fSize = 3;
      TPZVec<int>::TPZVec(&local_190.fPivot.super_TPZVec<int>,0);
      local_190.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_190.fPivot.super_TPZVec<int>.fStore = local_190.fPivot.fExtAlloc;
      local_190.fPivot.super_TPZVec<int>.fNElements = 0;
      local_190.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_190.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_190.fWork.fStore = (double *)0x0;
      local_190.fWork.fNElements = 0;
      local_190.fWork.fNAlloc = 0;
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_0186cb38;
      TPZFMatrix<double>::operator=(&local_190,0.0);
      TPZMatrix<double>::Multiply((TPZMatrix<double> *)this_00,&local_2f0,&local_190,0);
      if (this->fDim < 1) {
        local_3d0 = 0.0;
      }
      else {
        local_3d0 = 0.0;
        lVar12 = 0;
        do {
          if ((local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar12) ||
             (local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar3 = local_190.fElem[lVar12];
          (*(pTVar2->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x24])(pTVar2,lVar12,lVar13);
          local_3d0 = local_3d0 + dVar3 * extraout_XMM0_Qa_00;
          lVar12 = lVar12 + 1;
        } while (lVar12 < this->fDim);
      }
      uVar15 = 0;
      do {
        ppVar9 = (data->super_TPZMaterialData).fVecShapeIndex.super_TPZVec<std::pair<int,_long>_>.
                 fStore;
        iVar7 = ppVar9[uVar15].first;
        lVar12 = ppVar9[uVar15].second;
        lVar14 = 0;
        do {
          if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar14) ||
             (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_e0.fElem[lVar14] =
               (data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.fElem
               [(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * (long)iVar7 + lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_2f8 = *local_2f0.fElem;
        if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_300 = *local_e0.fElem;
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar3 = local_2f0.fElem[1];
        if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
           (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar4 = local_e0.fElem[1];
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar5 = local_2f0.fElem[2];
        if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
           (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar6 = local_e0.fElem[2];
        (*(pTVar1->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable[0x24])(pTVar1,lVar13,0);
        local_390 = (int)lVar12;
        local_308 = extraout_XMM0_Qa_01;
        (*(pTVar1->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable[0x24])(pTVar1,(long)local_390,0);
        if (((ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar11) ||
           ((ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar15)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar12 = (ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar15;
        ek->fElem[lVar12 + uVar11] =
             local_308 * weight * extraout_XMM0_Qa_02 *
             (dVar5 * dVar6 + local_2f8 * local_300 + dVar3 * dVar4) + ek->fElem[lVar12 + uVar11];
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_0186ce28;
        local_240.fElem = local_310;
        local_240.fGiven = local_310;
        local_240.fSize = 3;
        TPZVec<int>::TPZVec(&local_240.fPivot.super_TPZVec<int>,0);
        local_240.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
        local_240.fPivot.super_TPZVec<int>.fStore = local_240.fPivot.fExtAlloc;
        local_240.fPivot.super_TPZVec<int>.fNElements = 0;
        local_240.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_240.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
        local_240.fWork.fStore = (double *)0x0;
        local_240.fWork.fNElements = 0;
        local_240.fWork.fNAlloc = 0;
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFNMatrix_0186cb38;
        TPZFMatrix<double>::operator=(&local_240,0.0);
        TPZMatrix<double>::Multiply((TPZMatrix<double> *)this_00,&local_e0,&local_240,0);
        if (this->fDim < 1) {
          local_3e8 = 0.0;
        }
        else {
          local_3e8 = 0.0;
          lVar12 = 0;
          do {
            if ((local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar12) ||
               (local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar3 = local_240.fElem[lVar12];
            (*(pTVar2->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x24])(pTVar2,lVar12,(long)local_390);
            local_3e8 = local_3e8 + dVar3 * extraout_XMM0_Qa_03;
            lVar12 = lVar12 + 1;
          } while (lVar12 < this->fDim);
        }
        if (((ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar11) ||
           ((ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar15)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar12 = (ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar15;
        ek->fElem[lVar12 + uVar11] = local_3e8 * local_3d0 * weight + ek->fElem[lVar12 + uVar11];
        TPZFMatrix<double>::~TPZFMatrix(&local_240,&PTR_PTR_0186cdf0);
        uVar15 = uVar15 + 1;
      } while (uVar15 != (local_3c0 & 0x7fffffff));
      TPZFMatrix<double>::~TPZFMatrix(&local_190,&PTR_PTR_0186cdf0);
      uVar11 = uVar11 + 1;
    } while (uVar11 != (local_3c0 & 0x7fffffff));
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_e0,&PTR_PTR_0186cdf0);
  TPZFMatrix<double>::~TPZFMatrix(&local_2f0,&PTR_PTR_0186cdf0);
  if (local_360.fStore == local_340) {
    local_360.fStore = (double *)0x0;
  }
  local_360.fNAlloc = 0;
  local_360._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_360.fStore != (double *)0x0) {
    operator_delete__(local_360.fStore);
  }
  return;
}

Assistant:

void TPZHDivProjection<TVar>::Contribute(const TPZMaterialDataT<TVar> &data,
                                       REAL weight,
                                       TPZFMatrix<TVar> &ek, TPZFMatrix<TVar> &ef){
	
	const int nshape = data.phi.Rows();
    //last position of solLoc is the divergence
    TPZManVector<TVar,4> solLoc(4);
    if(!this->HasForcingFunction()){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" a forcing function (solution to be projected)\n";
        PZError<<"has not been set! Aborting...\n";
        DebugStop();
    }
    this->fForcingFunction(data.x,solLoc);
    const TVar divSol = solLoc[3];

    /*
     * HDiv approximation spaces in NeoPZ are created 
     * from the combination of scalar functions with 
     * constant vector fields
     */
    
    // Setting the scalar phis
    const TPZFMatrix<REAL> &phiQ = data.phi;
    const TPZFMatrix<REAL> &dphiQ = data.dphix;
    
    const int phrq = data.fVecShapeIndex.NElements();
    
    //Calculate the matrix contribution for flux. Matrix A
    TPZFNMatrix<3,REAL> ivec(3,1,0.);
    TPZFNMatrix<3,REAL> jvec(3,1,0.);
    for(int iq=0; iq<phrq; iq++)
    {
        //ef(iq, 0) += 0.;
        const int ivecind = data.fVecShapeIndex[iq].first;
        const int ishapeind = data.fVecShapeIndex[iq].second;
        
        for(int id=0; id<3; id++){
            ivec(id,0) = data.fDeformedDirections.GetVal(id,ivecind);
        }
        TVar ff = 0.;
        
        for (int i=0; i<3; i++) {
            ff += ivec(i,0)*solLoc[i];
        }
        
        ef(iq,0) += weight*ff*phiQ.GetVal(ishapeind,0);
        REAL divqi = 0.;
        TPZFNMatrix<3,REAL> axesvec(3,1,0.);
        data.axes.Multiply(ivec,axesvec);
        //computin div(qj)
        for(int iloc=0; iloc<fDim; iloc++){
            divqi += axesvec(iloc,0)*dphiQ.GetVal(iloc,ishapeind);
        }
        for (int jq=0; jq<phrq; jq++)
        {
            int jvecind = data.fVecShapeIndex[jq].first;
            int jshapeind = data.fVecShapeIndex[jq].second;
            
            for(int id=0; id<3; id++){
                jvec(id,0) = data.fDeformedDirections.GetVal(id,jvecind);
            }
            
            //jvecZ.Print("mat1 = ");
            const REAL prod1 = ivec(0,0)*jvec(0,0) + ivec(1,0)*jvec(1,0) + ivec(2,0)*jvec(2,0);
            ek(iq,jq) +=
                    weight*phiQ.GetVal(ishapeind,0)*phiQ.GetVal(jshapeind,0)*prod1;

            REAL divqj = 0.;
            TPZFNMatrix<3,REAL> axesvec(3,1,0.);
            data.axes.Multiply(jvec,axesvec);
            //computin div(qj)
            for(int jloc=0; jloc<fDim; jloc++){
                divqj += axesvec(jloc,0)*dphiQ.GetVal(jloc,jshapeind);
            }
            ek(iq,jq) += weight*divqi*divqj;
        }
    }
}